

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O0

Map * __thiscall
Clasp::ClaspStatistics::Impl::writable<Clasp::ClaspStatistics::Impl::Map>(Impl *this,Key_t k)

{
  bool bVar1;
  size_t sVar2;
  Map *pMVar3;
  StatisticObject *in_RSI;
  Key_t in_RDI;
  Impl *unaff_retaddr;
  StatisticObject obj;
  uint64 in_stack_ffffffffffffffd8;
  size_t sVar4;
  StatisticObject local_18;
  
  local_18 = StatisticObject::fromRep(in_stack_ffffffffffffffd8);
  bVar1 = writable(unaff_retaddr,in_RDI);
  if (!bVar1) {
    Potassco::fail(-2,
                   "T *Clasp::ClaspStatistics::Impl::writable(Key_t) const [T = Clasp::ClaspStatistics::Impl::Map]"
                   ,0xcd,"writable(k)","key not writable",0);
  }
  sVar4 = Map::id_s;
  sVar2 = StatisticObject::typeId(&local_18);
  if (sVar4 != sVar2) {
    Potassco::fail(-2,
                   "T *Clasp::ClaspStatistics::Impl::writable(Key_t) const [T = Clasp::ClaspStatistics::Impl::Map]"
                   ,0xce,"T::id_s == obj.typeId()","type error",0);
  }
  pMVar3 = (Map *)StatisticObject::self(in_RSI);
  return pMVar3;
}

Assistant:

T* writable(Key_t k) const {
		StatisticObject obj = StatisticObject::fromRep(k);
		POTASSCO_REQUIRE(writable(k), "key not writable");
		POTASSCO_REQUIRE(T::id_s == obj.typeId(), "type error");
		return static_cast<T*>(const_cast<void*>(obj.self()));
	}